

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_sync.cpp
# Opt level: O0

bool __thiscall
VerboseVerification<boost::asio::ssl::host_name_verification>::operator()
          (VerboseVerification<boost::asio::ssl::host_name_verification> *this,bool preverified,
          verify_context *ctx)

{
  bool bVar1;
  X509_STORE_CTX *ctx_00;
  X509 *a;
  X509_NAME *a_00;
  ostream *poVar2;
  void *this_00;
  bool verified;
  X509 *cert;
  char subject_name [256];
  verify_context *ctx_local;
  bool preverified_local;
  VerboseVerification<boost::asio::ssl::host_name_verification> *this_local;
  
  ctx_00 = (X509_STORE_CTX *)boost::asio::ssl::verify_context::native_handle(ctx);
  a = X509_STORE_CTX_get_current_cert(ctx_00);
  a_00 = X509_get_subject_name(a);
  X509_NAME_oneline(a_00,(char *)&cert,0x100);
  bVar1 = boost::asio::ssl::host_name_verification::operator()(&this->verifier_,preverified,ctx);
  poVar2 = std::operator<<((ostream *)&std::cout,"Verifying: ");
  poVar2 = std::operator<<(poVar2,(char *)&cert);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Verified: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return bVar1;
}

Assistant:

bool operator()(bool preverified, ssl::verify_context& ctx) {
    char subject_name[256];
    X509* cert = X509_STORE_CTX_get_current_cert(ctx.native_handle());
    X509_NAME_oneline(X509_get_subject_name(cert), subject_name, 256);

    bool verified = verifier_(preverified, ctx);
    std::cout << "Verifying: " << subject_name << std::endl;
    std::cout << "Verified: " << verified << std::endl;
    return verified;
  }